

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O3

boolean decode_mcu_AC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  jpeg_entropy_decoder *pjVar5;
  int *piVar6;
  JBLOCKROW paJVar7;
  jpeg_source_mgr *pjVar8;
  jpeg_error_mgr *pjVar9;
  d_derived_tbl *htbl;
  boolean bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  uint nbits;
  uint uVar15;
  _func_void_j_decompress_ptr *get_buffer;
  int iVar16;
  long lVar17;
  undefined4 uVar18;
  uint uVar19;
  bitread_working_state br_state;
  int newnz_pos [64];
  uint local_1b0;
  int local_1a0;
  uint local_18c;
  bitread_working_state local_180;
  int local_154;
  j_decompress_ptr local_150;
  jpeg_entropy_decoder *local_148;
  d_derived_tbl *local_140;
  int aiStack_138 [66];
  
  pjVar5 = cinfo->entropy;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar5[3].decode_mcu != 0)) ||
     (bVar10 = process_restart(cinfo), bVar10 != 0)) {
    local_148 = pjVar5;
    if (*(int *)((long)&pjVar5[3].start_pass + 4) == 0) {
      bVar1 = (byte)cinfo->Al;
      uVar15 = 1 << (bVar1 & 0x1f);
      uVar11 = -1 << (bVar1 & 0x1f);
      iVar3 = cinfo->Se;
      piVar6 = cinfo->natural_order;
      local_180.next_input_byte = cinfo->src->next_input_byte;
      local_180.bytes_in_buffer = cinfo->src->bytes_in_buffer;
      get_buffer = pjVar5[1].start_pass;
      uVar13 = (ulong)*(uint *)&pjVar5[1].decode_mcu;
      iVar14 = *(int *)&pjVar5[2].start_pass;
      paJVar7 = *MCU_data;
      iVar16 = cinfo->Ss;
      local_1a0 = 0;
      local_180.cinfo = cinfo;
      local_150 = cinfo;
      if (iVar3 < iVar16 || iVar14 != 0) {
        local_1b0 = 0;
LAB_0027ff34:
        uVar18 = (undefined4)uVar13;
        if (iVar14 != 0) {
LAB_0027ff3c:
          uVar18 = (undefined4)uVar13;
          if (iVar16 <= iVar3) {
            lVar17 = 0;
            do {
              uVar19 = (uint)uVar13;
              iVar4 = piVar6[iVar16 + lVar17];
              if ((*paJVar7)[iVar4] != 0) {
                if (((int)uVar19 < 1) &&
                   (bVar10 = jpeg_fill_bit_buffer(&local_180,(bit_buf_type)get_buffer,uVar19,1),
                   get_buffer = (_func_void_j_decompress_ptr *)local_180.get_buffer,
                   uVar19 = local_180.bits_left, bVar10 == 0)) {
LAB_002802e5:
                  if ((int)local_1b0 < 1) {
                    return 0;
                  }
                  uVar13 = (ulong)local_1b0 + 1;
                  do {
                    (*paJVar7)[aiStack_138[uVar13 - 2]] = 0;
                    uVar13 = uVar13 - 1;
                  } while (1 < uVar13);
                  return 0;
                }
                uVar13 = (ulong)(uVar19 - 1);
                if ((((ulong)get_buffer >> (uVar13 & 0x3f) & 1) != 0) &&
                   (sVar2 = (*paJVar7)[iVar4], (uVar15 & (int)sVar2) == 0)) {
                  uVar19 = uVar15;
                  if (sVar2 < 0) {
                    uVar19 = uVar11;
                  }
                  (*paJVar7)[iVar4] = (short)uVar19 + sVar2;
                }
              }
              uVar18 = (undefined4)uVar13;
              lVar17 = lVar17 + 1;
            } while ((iVar3 - iVar16) + 1 != (int)lVar17);
          }
          local_1a0 = iVar14 + -1;
        }
      }
      else {
        local_140 = (d_derived_tbl *)pjVar5[6].start_pass;
        local_1b0 = 0;
        do {
          htbl = local_140;
          uVar19 = (uint)uVar13;
          if ((int)uVar19 < 8) {
            bVar10 = jpeg_fill_bit_buffer(&local_180,(bit_buf_type)get_buffer,uVar19,0);
            if (bVar10 == 0) goto LAB_002802e5;
            get_buffer = (_func_void_j_decompress_ptr *)local_180.get_buffer;
            uVar19 = local_180.bits_left;
            if (7 < local_180.bits_left) goto LAB_0028008c;
            iVar14 = 1;
LAB_002800c7:
            uVar12 = jpeg_huff_decode(&local_180,(bit_buf_type)get_buffer,uVar19,htbl,iVar14);
            get_buffer = (_func_void_j_decompress_ptr *)local_180.get_buffer;
            uVar19 = local_180.bits_left;
            if ((int)uVar12 < 0) goto LAB_002802e5;
          }
          else {
LAB_0028008c:
            uVar13 = (long)get_buffer >> ((char)uVar19 - 8U & 0x3f) & 0xff;
            if (htbl->look_nbits[uVar13] == 0) {
              iVar14 = 9;
              goto LAB_002800c7;
            }
            uVar12 = (uint)htbl->look_sym[uVar13];
            uVar19 = uVar19 - htbl->look_nbits[uVar13];
          }
          uVar13 = (ulong)uVar19;
          nbits = uVar12 >> 4;
          if ((uVar12 & 0xf) == 0) {
            if (nbits != 0xf) {
              iVar14 = 1 << ((byte)nbits & 0x1f);
              if (uVar12 < 0x10) goto LAB_0027ff3c;
              if (((int)uVar19 < (int)nbits) &&
                 (bVar10 = jpeg_fill_bit_buffer(&local_180,(bit_buf_type)get_buffer,uVar19,nbits),
                 get_buffer = (_func_void_j_decompress_ptr *)local_180.get_buffer,
                 uVar19 = local_180.bits_left, bVar10 == 0)) goto LAB_002802e5;
              uVar13 = (ulong)(uVar19 - nbits);
              iVar14 = ((uint)((long)get_buffer >> ((byte)(uVar19 - nbits) & 0x3f)) & bmask[nbits])
                       + iVar14;
              goto LAB_0027ff34;
            }
            local_18c = 0;
          }
          else {
            if ((uVar12 & 0xf) != 1) {
              pjVar9 = local_150->err;
              pjVar9->msg_code = 0x79;
              (*pjVar9->emit_message)((j_common_ptr)local_150,-1);
            }
            if (((int)uVar19 < 1) &&
               (bVar10 = jpeg_fill_bit_buffer(&local_180,(bit_buf_type)get_buffer,uVar19,1),
               get_buffer = (_func_void_j_decompress_ptr *)local_180.get_buffer,
               uVar19 = local_180.bits_left, bVar10 == 0)) goto LAB_002802e5;
            uVar13 = (ulong)(uVar19 - 1);
            local_18c = uVar15;
            if (((ulong)get_buffer >> (uVar13 & 0x3f) & 1) == 0) {
              local_18c = uVar11;
            }
          }
          local_154 = iVar3;
          if (iVar3 < iVar16) {
            local_154 = iVar16;
          }
          local_154 = local_154 + 1;
          lVar17 = (long)iVar16 + -1;
          do {
            uVar19 = (uint)uVar13;
            iVar14 = piVar6[lVar17 + 1];
            if ((*paJVar7)[iVar14] == 0) {
              iVar14 = iVar16;
              if ((int)nbits < 1) break;
              nbits = nbits - 1;
            }
            else {
              if (((int)uVar19 < 1) &&
                 (bVar10 = jpeg_fill_bit_buffer(&local_180,(bit_buf_type)get_buffer,uVar19,1),
                 get_buffer = (_func_void_j_decompress_ptr *)local_180.get_buffer,
                 uVar19 = local_180.bits_left, bVar10 == 0)) goto LAB_002802e5;
              uVar13 = (ulong)(uVar19 - 1);
              if ((((ulong)get_buffer >> (uVar13 & 0x3f) & 1) != 0) &&
                 (sVar2 = (*paJVar7)[iVar14], (uVar15 & (int)sVar2) == 0)) {
                uVar19 = uVar15;
                if (sVar2 < 0) {
                  uVar19 = uVar11;
                }
                (*paJVar7)[iVar14] = (short)uVar19 + sVar2;
              }
            }
            iVar16 = iVar16 + 1;
            lVar17 = lVar17 + 1;
            iVar14 = local_154;
          } while (lVar17 < iVar3);
          uVar18 = (undefined4)uVar13;
          if (local_18c != 0) {
            iVar16 = piVar6[iVar14];
            (*paJVar7)[iVar16] = (JCOEF)local_18c;
            lVar17 = (long)(int)local_1b0;
            local_1b0 = local_1b0 + 1;
            aiStack_138[lVar17] = iVar16;
          }
          iVar16 = iVar14 + 1;
        } while (iVar14 < iVar3);
        local_1a0 = 0;
      }
      pjVar8 = local_150->src;
      pjVar8->next_input_byte = local_180.next_input_byte;
      pjVar8->bytes_in_buffer = local_180.bytes_in_buffer;
      local_148[1].start_pass = get_buffer;
      *(undefined4 *)&local_148[1].decode_mcu = uVar18;
      *(int *)&local_148[2].start_pass = local_1a0;
    }
    *(int *)&local_148[3].decode_mcu = *(int *)&local_148[3].decode_mcu + -1;
    bVar10 = 1;
  }
  else {
    bVar10 = 0;
  }
  return bVar10;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_refine (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  JCOEFPTR thiscoef;
  unsigned char *st;
  int tbl, k, kex;
  int p1, m1;
  const int * natural_order;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  natural_order = cinfo->natural_order;

  /* There is always only one block per MCU */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  p1 = 1 << cinfo->Al;		/* 1 in the bit position being coded */
  m1 = (-1) << cinfo->Al;	/* -1 in the bit position being coded */

  /* Establish EOBx (previous stage end-of-block) index */
  for (kex = cinfo->Se; kex > 0; kex--)
    if ((*block)[natural_order[kex]]) break;

  for (k = cinfo->Ss; k <= cinfo->Se; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (k > kex)
      if (arith_decode(cinfo, st)) break;	/* EOB flag */
    for (;;) {
      thiscoef = *block + natural_order[k];
      if (*thiscoef) {				/* previously nonzero coef */
	if (arith_decode(cinfo, st + 2)) {
	  if (*thiscoef < 0)
	    *thiscoef += m1;
	  else
	    *thiscoef += p1;
	}
	break;
      }
      if (arith_decode(cinfo, st + 1)) {	/* newly nonzero coef */
	if (arith_decode(cinfo, entropy->fixed_bin))
	  *thiscoef = m1;
	else
	  *thiscoef = p1;
	break;
      }
      st += 3; k++;
      if (k > cinfo->Se) {
	WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	entropy->ct = -1;			/* spectral overflow */
	return TRUE;
      }
    }
  }

  return TRUE;
}